

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O2

ptr<resp_msg> __thiscall cornerstone::raft_server::handle_vote_req(raft_server *this,req_msg *req)

{
  int iVar1;
  ulong uVar2;
  _func_int **pp_Var3;
  pointer psVar4;
  bool bVar5;
  long lVar6;
  _func_int *p_Var7;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  shared_ptr<cornerstone::resp_msg> sVar9;
  ptr<resp_msg> pVar10;
  int local_50;
  undefined4 uStack_4c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined4 local_2c;
  
  local_40 = ((req[3].log_entries_.
               super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
             super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_50 = 2;
  local_2c = *(undefined4 *)(in_RDX + 0x14);
  sVar9 = std::make_shared<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int>
                    ((unsigned_long *)this,(msg_type *)&local_40,&local_50,
                     (int *)((long)&(req->super_msg_base).term_ + 4));
  uVar2 = *(ulong *)(in_RDX + 0x20);
  pp_Var3 = req[4].super_msg_base._vptr_msg_base;
  (**(code **)(*pp_Var3 + 0x20))
            (&local_40,pp_Var3,
             sVar9.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi._M_pi);
  if (local_40->term_ < uVar2) {
    bVar5 = false;
  }
  else {
    lVar6 = *(long *)(in_RDX + 0x20);
    (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x20))(&local_50);
    bVar5 = true;
    if (lVar6 == *(long *)CONCAT44(uStack_4c,local_50)) {
      lVar6 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
      bVar5 = *(ulong *)(in_RDX + 0x28) < lVar6 - 1U;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  _Var8._M_pi = extraout_RDX;
  if (!bVar5) {
    psVar4 = req[3].log_entries_.
             super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((*(element_type **)(in_RDX + 8) ==
         (psVar4->super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) &&
       ((iVar1 = *(int *)&(psVar4->
                          super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount._M_pi, iVar1 == -1 || (iVar1 == *(int *)(in_RDX + 0x14))))) {
      pp_Var3 = this->_vptr_raft_server;
      p_Var7 = (_func_int *)(**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
      pp_Var3[4] = p_Var7;
      *(undefined1 *)(pp_Var3 + 5) = 1;
      *(undefined4 *)
       &((req[3].log_entries_.
          super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->
        super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           *(undefined4 *)(in_RDX + 0x14);
      (**(code **)(((((req->log_entries_).
                      super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                   ->term_ + 0x20))();
      _Var8._M_pi = extraout_RDX_00;
    }
  }
  pVar10.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  pVar10.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar10.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_vote_req(req_msg& req)
{
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::vote_response, id_, req.get_src()));
    bool log_okay = req.get_last_log_term() > log_store_->last_entry()->get_term() ||
                    (req.get_last_log_term() == log_store_->last_entry()->get_term() &&
                     log_store_->next_slot() - 1 <= req.get_last_log_idx());
    bool grant = req.get_term() == state_->get_term() && log_okay &&
                 (state_->get_voted_for() == req.get_src() || state_->get_voted_for() == -1);
    if (grant)
    {
        resp->accept(log_store_->next_slot());
        state_->set_voted_for(req.get_src());
        ctx_->state_mgr_->save_state(*state_);
    }

    return resp;
}